

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_wad.cpp
# Opt level: O2

bool __thiscall FWadFile::IsMarker(FWadFile *this,int lump,char *marker)

{
  FWadFileLump *pFVar1;
  int iVar2;
  
  pFVar1 = this->Lumps;
  if (pFVar1[lump].super_FResourceLump.field_3.Name[0] == *marker) {
    iVar2 = strcmp(pFVar1[lump].super_FResourceLump.field_3.Name,marker);
    if (iVar2 == 0) {
      return true;
    }
    if (marker[1] == '_') {
      iVar2 = strcmp(pFVar1[lump].super_FResourceLump.field_3.Name + 1,marker);
      return iVar2 == 0;
    }
  }
  return false;
}

Assistant:

inline bool FWadFile::IsMarker(int lump, const char *marker)
{
	if (Lumps[lump].Name[0] == marker[0])
	{
		return (!strcmp(Lumps[lump].Name, marker) ||
			(marker[1] == '_' && !strcmp(Lumps[lump].Name+1, marker)));
	}
	else return false;
}